

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCharData(xmlParserCtxtPtr ctxt,int cdata)

{
  byte *pbVar1;
  byte bVar2;
  uchar uVar3;
  charactersSAXFunc UNRECOVERED_JUMPTABLE;
  charactersSAXFunc p_Var4;
  int iVar5;
  uint val;
  xmlType xVar6;
  int iVar7;
  xmlParserInputPtr pxVar8;
  long lVar9;
  ignorableWhitespaceSAXFunc p_Var10;
  int iVar11;
  xmlChar *pxVar12;
  _xmlSAXHandler *p_Var13;
  ulong uVar14;
  byte *pbVar15;
  uint len;
  int len_00;
  byte *pbVar16;
  bool bVar17;
  xmlChar buf [305];
  int local_170;
  int local_16c;
  xmlChar local_168 [312];
  
  pxVar8 = ctxt->input;
  iVar5 = pxVar8->line;
  iVar7 = pxVar8->col;
  if (ctxt->progressive == 0) {
    if ((500 < (long)pxVar8->cur - (long)pxVar8->base) &&
       ((long)pxVar8->end - (long)pxVar8->cur < 500)) {
      xmlSHRINK(ctxt);
      pxVar8 = ctxt->input;
      if (ctxt->progressive != 0) goto LAB_0015e0e2;
    }
    if ((long)pxVar8->end - (long)pxVar8->cur < 0xfa) {
      xmlGROW(ctxt);
      pxVar8 = ctxt->input;
    }
  }
LAB_0015e0e2:
  if ((cdata == 0) && (ctxt->mlType == XML_TYPE_XML)) {
    pbVar16 = pxVar8->cur;
    do {
      while( true ) {
        while( true ) {
          bVar2 = *pbVar16;
          uVar14 = (ulong)bVar2;
          if (bVar2 != 10) break;
          iVar11 = pxVar8->line;
          pbVar15 = pbVar16;
          do {
            iVar11 = iVar11 + 1;
            pxVar8->line = iVar11;
            pxVar8->col = 1;
            pbVar16 = pbVar15 + 1;
            pbVar1 = pbVar15 + 1;
            pbVar15 = pbVar16;
          } while (*pbVar1 == 10);
        }
        if (bVar2 != 0x20) break;
        pbVar16 = pbVar16 + 1;
        pxVar8->col = pxVar8->col + 1;
      }
      if (bVar2 == 0x3c) {
        pxVar12 = pxVar8->cur;
        iVar5 = (int)pbVar16 - (int)pxVar12;
        if (iVar5 < 1) {
          return;
        }
        pxVar8->cur = pbVar16;
        p_Var13 = ctxt->sax;
        if (p_Var13 != (_xmlSAXHandler *)0x0) {
          UNRECOVERED_JUMPTABLE = p_Var13->characters;
          p_Var4 = p_Var13->ignorableWhitespace;
          if (p_Var4 != UNRECOVERED_JUMPTABLE) {
            iVar7 = areBlanks(ctxt,pxVar12,iVar5,1);
            if (iVar7 == 0) {
              UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar12,iVar5);
              }
              if (*ctxt->space != -1) {
                return;
              }
              *ctxt->space = -2;
              return;
            }
            UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
            p_Var4 = UNRECOVERED_JUMPTABLE;
          }
          if (p_Var4 == (charactersSAXFunc)0x0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar12,iVar5);
          return;
        }
        return;
      }
      iVar11 = pxVar8->col;
      while( true ) {
        while( true ) {
          uVar3 = ""[uVar14];
          pbVar15 = pbVar16;
          while (uVar3 != '\0') {
            iVar11 = iVar11 + 1;
            pbVar16 = pbVar15 + 1;
            pbVar15 = pbVar15 + 1;
            uVar3 = ""[*pbVar16];
          }
          pxVar8->col = iVar11;
          if (*pbVar15 != 0x5d) break;
          pbVar16 = pbVar15 + 1;
          if ((pbVar15[1] == 0x5d) && (pbVar15[2] == 0x3e)) {
            xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
            ctxt->input->cur = pbVar16;
            return;
          }
          iVar11 = iVar11 + 1;
          pxVar8->col = iVar11;
          uVar14 = (ulong)*pbVar16;
        }
        if (*pbVar15 != 10) break;
        iVar11 = pxVar8->line;
        do {
          iVar11 = iVar11 + 1;
          pxVar8->line = iVar11;
          pxVar8->col = 1;
          pbVar16 = pbVar15 + 1;
          uVar14 = (ulong)*pbVar16;
          pbVar15 = pbVar15 + 1;
        } while (*pbVar16 == 10);
        iVar11 = 1;
        pbVar16 = pbVar15;
      }
      pbVar16 = pxVar8->cur;
      len_00 = (int)pbVar15 - (int)pbVar16;
      local_16c = cdata;
      if (0 < len_00) {
        p_Var13 = ctxt->sax;
        if (p_Var13 != (_xmlSAXHandler *)0x0) {
          UNRECOVERED_JUMPTABLE = p_Var13->characters;
          if (((p_Var13->ignorableWhitespace == UNRECOVERED_JUMPTABLE) || (0x20 < (ulong)*pbVar16))
             || ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) == 0)) {
            iVar7 = iVar11;
            if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
              (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pbVar16,len_00);
              pxVar8 = ctxt->input;
              iVar7 = pxVar8->col;
            }
            iVar5 = pxVar8->line;
          }
          else {
            pxVar8->cur = pbVar15;
            iVar5 = areBlanks(ctxt,pbVar16,len_00,0);
            if (iVar5 == 0) {
              UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pbVar16,len_00);
              }
              if (*ctxt->space == -1) {
                *ctxt->space = -2;
              }
            }
            else {
              p_Var10 = ctxt->sax->ignorableWhitespace;
              if (p_Var10 != (ignorableWhitespaceSAXFunc)0x0) {
                (*p_Var10)(ctxt->userData,pbVar16,len_00);
              }
            }
            pxVar8 = ctxt->input;
            iVar5 = pxVar8->line;
            iVar7 = pxVar8->col;
          }
        }
        if (ctxt->instate != XML_PARSER_CONTENT) {
          return;
        }
      }
      cdata = local_16c;
      pxVar8->cur = pbVar15;
      bVar2 = *pbVar15;
      if (bVar2 == 0xd) {
        if (pbVar15[1] != 10) goto LAB_0015e2f3;
        pxVar8->cur = pbVar15 + 1;
        pxVar8->line = pxVar8->line + 1;
        pbVar16 = pbVar15 + 2;
        pxVar8->col = 1;
      }
      else {
        if (bVar2 == 0x26) {
          return;
        }
        if (bVar2 == 0x3c) {
          return;
        }
LAB_0015e2f3:
        if ((ctxt->progressive == 0) &&
           (((((long)pbVar15 - (long)pxVar8->base < 0x1f5 ||
              (499 < (long)pxVar8->end - (long)pbVar15)) ||
             (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
            ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return;
        }
        pxVar8 = ctxt->input;
        pbVar16 = pxVar8->cur;
      }
    } while ((byte)(*pbVar16 - 9) < 2 || '\x1f' < (char)*pbVar16);
  }
  pxVar8->line = iVar5;
  pxVar8->col = iVar7;
  if (ctxt->progressive == 0) {
    pxVar12 = pxVar8->cur;
    if ((500 < (long)pxVar12 - (long)pxVar8->base) && ((long)pxVar8->end - (long)pxVar12 < 500)) {
      xmlSHRINK(ctxt);
      if (ctxt->progressive != 0) goto LAB_0015e3e7;
      pxVar8 = ctxt->input;
      pxVar12 = pxVar8->cur;
    }
    if ((long)pxVar8->end - (long)pxVar12 < 0xfa) {
      xmlGROW(ctxt);
    }
  }
LAB_0015e3e7:
  val = xmlCurrentChar(ctxt,&local_170);
  len = 0;
  iVar5 = 0;
  do {
    xVar6 = ctxt->mlType;
    if (val == 0x3c || xVar6 != XML_TYPE_XML) {
      if (xVar6 != XML_TYPE_SML) goto LAB_0015e82b;
      if (val == 0x22) {
        if (ctxt->quoted != 0) {
          val = 0x22;
          goto LAB_0015e82b;
        }
        goto LAB_0015e524;
      }
      if (val != 0x7d) {
        if (val == 0x26) goto LAB_0015e82b;
        goto LAB_0015e44c;
      }
      val = 0x7d;
      if (ctxt->quoted == 0) goto LAB_0015e82b;
    }
    else {
      if (val == 0x26) {
        val = 0x26;
        goto LAB_0015e82b;
      }
LAB_0015e44c:
      if ((int)val < 0x100) {
        if (((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) && ((int)val < 0x20))
        goto LAB_0015e82b;
      }
      else if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val))
      goto LAB_0015e82b;
      bVar17 = xVar6 == XML_TYPE_SML;
      if ((bVar17) && (ctxt->quoted == 0)) {
LAB_0015e524:
        if (ctxt->curly == 0) {
          bVar17 = true;
          if (val == 0x5d) goto LAB_0015e4c3;
          if ((val == 10) || (val == 0x3b)) goto LAB_0015e82b;
        }
        else if ((0x20 < val) || ((0x100002600U >> ((ulong)val & 0x3f) & 1) == 0))
        goto LAB_0015e82b;
      }
      else {
        if (val == 0x5d) {
LAB_0015e4c3:
          pxVar12 = ctxt->input->cur;
          if ((pxVar12[1] == ']') && (pxVar12[2] == '>')) {
            if ((bVar17) && (ctxt->quoted != 0)) {
              val = 0x5d;
              goto LAB_0015e5de;
            }
            if (cdata != 0) {
              val = 0x5d;
LAB_0015e82b:
              if (((len != 0) && (local_168[(int)len] = '\0', ctxt->sax != (_xmlSAXHandler *)0x0))
                 && (ctxt->disableSAX == 0)) {
                iVar5 = areBlanks(ctxt,local_168,len,0);
                p_Var13 = ctxt->sax;
                if (iVar5 == 0) {
                  if (p_Var13->characters == (charactersSAXFunc)0x0) {
                    p_Var10 = (ignorableWhitespaceSAXFunc)0x0;
                  }
                  else {
                    (*p_Var13->characters)(ctxt->userData,local_168,len);
                    p_Var13 = ctxt->sax;
                    p_Var10 = p_Var13->characters;
                  }
                  if ((p_Var10 != p_Var13->ignorableWhitespace) && (*ctxt->space == -1)) {
                    *ctxt->space = -2;
                  }
                }
                else if (p_Var13->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
                  (*p_Var13->ignorableWhitespace)(ctxt->userData,local_168,len);
                }
              }
              if (val != 0) {
                if ((int)val < 0x100) {
                  if (0x1f < (int)val) {
                    return;
                  }
                  if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) {
                    return;
                  }
                }
                else if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) {
                  return;
                }
                xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"PCDATA invalid Char value %d\n",val);
                pxVar8 = ctxt->input;
                if (*pxVar8->cur == '\n') {
                  pxVar8->line = pxVar8->line + 1;
                  pxVar8->col = 1;
                }
                else {
                  pxVar8->col = pxVar8->col + 1;
                }
                pxVar8->cur = pxVar8->cur + local_170;
              }
              return;
            }
            xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
            xVar6 = ctxt->mlType;
          }
        }
        if (((xVar6 == XML_TYPE_SML) && (val == 0x5c)) && (ctxt->quoted != 0)) {
          pxVar8 = ctxt->input;
          if (*pxVar8->cur == '\n') {
            pxVar8->line = pxVar8->line + 1;
            pxVar8->col = 1;
          }
          else {
            pxVar8->col = pxVar8->col + 1;
          }
          iVar5 = iVar5 + 1;
          pxVar8->cur = pxVar8->cur + local_170;
          val = xmlCurrentChar(ctxt,&local_170);
        }
      }
    }
LAB_0015e5de:
    if (local_170 == 1) {
      lVar9 = (long)(int)len;
      len = len + 1;
      local_168[lVar9] = (xmlChar)val;
    }
    else {
      iVar7 = xmlCopyCharMultiByte(local_168 + (int)len,val);
      len = len + iVar7;
    }
    if (299 < (int)len) {
      local_168[len] = '\0';
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
        iVar7 = areBlanks(ctxt,local_168,len,0);
        p_Var13 = ctxt->sax;
        if (iVar7 == 0) {
          if (p_Var13->characters == (charactersSAXFunc)0x0) {
            p_Var10 = (ignorableWhitespaceSAXFunc)0x0;
          }
          else {
            (*p_Var13->characters)(ctxt->userData,local_168,len);
            p_Var13 = ctxt->sax;
            p_Var10 = p_Var13->characters;
          }
          if ((p_Var10 != p_Var13->ignorableWhitespace) && (*ctxt->space == -1)) {
            *ctxt->space = -2;
          }
        }
        else if (p_Var13->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
          (*p_Var13->ignorableWhitespace)(ctxt->userData,local_168,len);
        }
      }
      len = 0;
      if (ctxt->instate != XML_PARSER_CONTENT) {
        return;
      }
    }
    if (iVar5 < 0x32) {
      iVar5 = iVar5 + 1;
    }
    else {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar5 = 0;
      if (ctxt->instate == XML_PARSER_EOF) {
        return;
      }
    }
    pxVar8 = ctxt->input;
    if (*pxVar8->cur == '\n') {
      pxVar8->line = pxVar8->line + 1;
      pxVar8->col = 1;
    }
    else {
      pxVar8->col = pxVar8->col + 1;
    }
    pxVar8->cur = pxVar8->cur + local_170;
    val = xmlCurrentChar(ctxt,&local_170);
  } while( true );
}

Assistant:

void
xmlParseCharData(xmlParserCtxtPtr ctxt, int cdata) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;
    DEBUG_CODE(
    const xmlChar *cur0 = ctxt->input->cur;
    );

    DEBUG_ENTER(("xmlParseCharData(%s, %d);\n", dbgCtxt(ctxt), cdata));

    SHRINK;
    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    if (ISXML && !cdata) {
	in = ctxt->input->cur;
	do {
get_more_space:
	    while (*in == 0x20) { in++; ctxt->input->col++; }
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more_space;
	    }
	    if (*in == '<') {
		nbchar = in - ctxt->input->cur;
		if (nbchar > 0) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if ((ctxt->sax != NULL) &&
		        (ctxt->sax->ignorableWhitespace !=
		         ctxt->sax->characters)) {
			if (areBlanks(ctxt, tmp, nbchar, 1)) {
			    if (ctxt->sax->ignorableWhitespace != NULL)
				ctxt->sax->ignorableWhitespace(ctxt->userData,
						       tmp, nbchar);
			} else {
			    if (ctxt->sax->characters != NULL)
				ctxt->sax->characters(ctxt->userData,
						      tmp, nbchar);
			    if (*ctxt->space == -1)
			        *ctxt->space = -2;
			}
		    } else if ((ctxt->sax != NULL) &&
		               (ctxt->sax->characters != NULL)) {
			ctxt->sax->characters(ctxt->userData,
					      tmp, nbchar);
		    }
		}
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }

get_more:
            ccol = ctxt->input->col;
	    while (test_char_data[*in]) {
		in++;
		ccol++;
	    }
	    ctxt->input->col = ccol;
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more;
	    }
	    if (*in == ']') {
		if ((in[1] == ']') && (in[2] == '>')) {
		    xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
		    ctxt->input->cur = in + 1;
		    RETURN();
		}
		in++;
		ctxt->input->col++;
		goto get_more;
	    }
	    nbchar = in - ctxt->input->cur;
	    if (nbchar > 0) {
		if ((ctxt->sax != NULL) &&
		    (ctxt->sax->ignorableWhitespace !=
		     ctxt->sax->characters) &&
		    (IS_BLANK_CH(*ctxt->input->cur))) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if (areBlanks(ctxt, tmp, nbchar, 0)) {
		        if (ctxt->sax->ignorableWhitespace != NULL)
			    ctxt->sax->ignorableWhitespace(ctxt->userData,
							   tmp, nbchar);
		    } else {
		        if (ctxt->sax->characters != NULL)
			    ctxt->sax->characters(ctxt->userData,
						  tmp, nbchar);
			if (*ctxt->space == -1)
			    *ctxt->space = -2;
		    }
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		} else if (ctxt->sax != NULL) {
		    if (ctxt->sax->characters != NULL)
			ctxt->sax->characters(ctxt->userData,
					      ctxt->input->cur, nbchar);
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		}
                /* something really bad happened in the SAX callback */
                if (ctxt->instate != XML_PARSER_CONTENT)
                    RETURN();
	    }
	    ctxt->input->cur = in;
	    if (*in == 0xD) {
		in++;
		if (*in == 0xA) {
		    ctxt->input->cur = in;
		    in++;
		    ctxt->input->line++; ctxt->input->col = 1;
		    continue; /* while */
		}
		in--;
	    }
	    if (*in == '<') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    if (*in == '&') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    SHRINK;
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF)
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    in = ctxt->input->cur;
	} while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
	nbchar = 0;
    }
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, cdata);
    /* In this complex case, the output text may be different from the parsed input string */
    RETURN_COMMENT(("parsed = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
}